

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_Internal_ExtrudedEdge::SetFromInitialEdge
          (ON_Internal_ExtrudedEdge *this,ON_SubDEdge *initial_edge)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  ON_SubDVertex *pOVar4;
  bool bVar5;
  ulong uVar6;
  ushort uVar7;
  ON_SubDFacePtr *pOVar8;
  ON_SubDEdge *pOVar9;
  unsigned_short fei;
  ushort uVar10;
  ulong *puVar11;
  
  this->m_extruded_vertex[1] = (ON_Internal_ExtrudedVertex *)0x0;
  this->m_new_face = (ON_SubDFace *)0x0;
  this->m_copied_edge = (ON_SubDEdge *)0x0;
  this->m_extruded_vertex[0] = (ON_Internal_ExtrudedVertex *)0x0;
  *(undefined8 *)&this->m_side_group_id = 0;
  this->m_original_edge = (ON_SubDEdge *)0x0;
  this->m_initial_edge_tag = Unset;
  *(undefined3 *)&this->field_0x1 = 0;
  this->m_initial_vertex_id[0] = 0;
  *(undefined8 *)(this->m_initial_vertex_id + 1) = 0;
  if (((initial_edge == (ON_SubDEdge *)0x0) || (initial_edge->m_vertex[0] == (ON_SubDVertex *)0x0))
     || (pOVar4 = initial_edge->m_vertex[1], pOVar4 == (ON_SubDVertex *)0x0)) {
    return false;
  }
  uVar3 = (initial_edge->m_vertex[0]->super_ON_SubDComponentBase).m_id;
  if (uVar3 == (pOVar4->super_ON_SubDComponentBase).m_id) {
LAB_005f366f:
    bVar5 = false;
  }
  else {
    uVar1 = initial_edge->m_face_count;
    if (uVar1 != 0) {
      pOVar8 = initial_edge->m_face2;
      uVar7 = 0;
      do {
        if ((uVar7 == 2) &&
           ((pOVar8 = initial_edge->m_facex, pOVar8 == (ON_SubDFacePtr *)0x0 ||
            ((int)(uint)initial_edge->m_facex_capacity < (int)(uVar1 - 2))))) goto LAB_005f366f;
        uVar6 = pOVar8->m_ptr & 0xfffffffffffffff8;
        if ((uVar6 == 0) || (uVar2 = *(ushort *)(uVar6 + 0x9c), uVar2 < 3)) goto LAB_005f366f;
        puVar11 = (ulong *)(uVar6 + 0xa0);
        uVar10 = 0;
        bVar5 = false;
        do {
          if ((uVar10 == 4) &&
             ((puVar11 = *(ulong **)(uVar6 + 0xc0), puVar11 == (ulong *)0x0 ||
              ((int)(uint)*(ushort *)(uVar6 + 0x9e) < (int)(uVar2 - 4))))) goto LAB_005f366f;
          pOVar9 = (ON_SubDEdge *)(*puVar11 & 0xfffffffffffffff8);
          if ((pOVar9 == (ON_SubDEdge *)0x0) ||
             ((((pOVar9->m_vertex[0] == (ON_SubDVertex *)0x0 ||
                (pOVar9->m_vertex[1] == (ON_SubDVertex *)0x0)) ||
               ((pOVar9->m_vertex[0]->super_ON_SubDComponentBase).m_id ==
                (pOVar9->m_vertex[1]->super_ON_SubDComponentBase).m_id)) ||
              ((pOVar9 == initial_edge &&
               ((bVar5 || (bVar5 = true, (((uint)*puVar11 ^ (uint)pOVar8->m_ptr) & 1) != 0))))))))
          goto LAB_005f366f;
          uVar10 = uVar10 + 1;
          puVar11 = puVar11 + 1;
        } while (uVar2 != uVar10);
        if (!bVar5) goto LAB_005f366f;
        uVar7 = uVar7 + 1;
        pOVar8 = pOVar8 + 1;
      } while (uVar7 != uVar1);
    }
    this->m_initial_edge_tag = initial_edge->m_edge_tag;
    this->m_initial_vertex_id[0] = uVar3;
    this->m_initial_vertex_id[1] = (pOVar4->super_ON_SubDComponentBase).m_id;
    this->m_initial_edge_face_count = (uint)uVar1;
    this->m_original_edge = initial_edge;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool SetFromInitialEdge(
    ON_SubDEdge* initial_edge
  )
  {
    *this = ON_Internal_ExtrudedEdge::Unset;

    if (nullptr == initial_edge)
      return false;
    if (nullptr == initial_edge->m_vertex[0] || nullptr == initial_edge->m_vertex[1] || initial_edge->m_vertex[0]->m_id == initial_edge->m_vertex[1]->m_id)
      return false;

    // validate edge / face topology information - corrupt information will cause great difficulties during the extrusion process
    const ON_SubDFacePtr* fptr = initial_edge->m_face2;
    for (unsigned short efi = 0; efi < initial_edge->m_face_count; ++efi, ++fptr)
    {
      if (2 == efi)
      {
        fptr = initial_edge->m_facex;
        if (nullptr == fptr)
          return false; // corrupt edge / face topology information
        if (initial_edge->m_facex_capacity < initial_edge->m_face_count - 2)
          return false; // corrupt edge / face topology information
      }
      const ON_SubDFace* f = ON_SUBD_FACE_POINTER(fptr->m_ptr);
      if (nullptr == f || f->m_edge_count < 3)
        return false; // corrupt edge / face topology information

      bool bFoundInitialEdge = false;
      const ON_SubDEdgePtr* eptr = f->m_edge4;
      for (unsigned short fei = 0; fei < f->m_edge_count; ++fei, ++eptr)
      {
        if (4 == fei)
        {
          eptr = f->m_edgex;
          if (nullptr == eptr)
            return false; // corrupt edge / face topology information
          if (f->m_edgex_capacity < f->m_edge_count - 4)
            return false; // corrupt edge / face topology information
        }
        const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
        if (nullptr == e)
          return false;
        if (nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0]->m_id == e->m_vertex[1]->m_id)
          return false;
        if (e == initial_edge)
        {
          if (bFoundInitialEdge)
            return false;
          bFoundInitialEdge = true;
          if (ON_SUBD_EDGE_DIRECTION(eptr->m_ptr) != ON_SUBD_FACE_DIRECTION(fptr->m_ptr))
            return false;
        }
      }
      if (false == bFoundInitialEdge)
        return false;
    }

    m_initial_edge_tag = initial_edge->m_edge_tag;
    m_initial_vertex_id[0] = initial_edge->m_vertex[0]->m_id;
    m_initial_vertex_id[1] = initial_edge->m_vertex[1]->m_id;
    m_initial_edge_face_count = initial_edge->m_face_count;
    m_original_edge = initial_edge;

    return true;
  }